

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdc.cpp
# Opt level: O1

void __thiscall
insyde_fdc_t::insyde_fdc_t
          (insyde_fdc_t *this,kstream *p__io,kstruct *p__parent,insyde_fdc_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__insyde_fdc_t_001a9ea8;
  (this->m_body)._M_dataplus._M_p = (pointer)&(this->m_body).field_2;
  (this->m_body)._M_string_length = 0;
  (this->m_body).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = this;
  this->f_len_fdc_store_header = false;
  _read(this);
  return;
}

Assistant:

insyde_fdc_t::insyde_fdc_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, insyde_fdc_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    f_len_fdc_store_header = false;
    _read();
}